

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

bool getComplementarityViolations
               (HighsLp *lp,HighsSolution *solution,double *max_complementarity_violation,
               double *sum_complementarity_violations)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  uint uVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  ulong uVar17;
  double *pdVar18;
  double *pdVar19;
  double dVar20;
  double dVar21;
  
  *max_complementarity_violation = INFINITY;
  *sum_complementarity_violations = INFINITY;
  bVar3 = solution->dual_valid;
  if (bVar3 == true) {
    *max_complementarity_violation = 0.0;
    *sum_complementarity_violations = 0.0;
    iVar4 = lp->num_col_;
    lVar12 = (long)iVar4;
    uVar13 = lp->num_row_ + iVar4;
    if (uVar13 != 0 && SCARRY4(lp->num_row_,iVar4) == (int)uVar13 < 0) {
      pdVar5 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + -lVar12;
      pdVar15 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar12;
      pdVar18 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar12;
      pdVar19 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar12;
      uVar17 = 0;
      do {
        pdVar10 = pdVar19;
        pdVar11 = pdVar15;
        pdVar14 = pdVar9;
        pdVar16 = pdVar18;
        if ((long)uVar17 < lVar12) {
          pdVar14 = pdVar5 + uVar17;
          pdVar11 = pdVar6 + uVar17;
          pdVar16 = pdVar7 + uVar17;
          pdVar10 = pdVar8 + uVar17;
        }
        dVar20 = *pdVar14;
        dVar1 = *pdVar16;
        dVar2 = *pdVar10;
        if ((-INFINITY < dVar1) || (dVar21 = 1.0, dVar2 < INFINITY)) {
          if ((dVar1 + dVar2) * 0.5 <= dVar20) {
            dVar21 = ABS(dVar2 - dVar20);
          }
          else {
            dVar21 = ABS(dVar1 - dVar20);
          }
        }
        dVar21 = ABS(*pdVar11) * dVar21;
        *sum_complementarity_violations = *sum_complementarity_violations + dVar21;
        dVar20 = *max_complementarity_violation;
        if (*max_complementarity_violation <= dVar21) {
          dVar20 = dVar21;
        }
        *max_complementarity_violation = dVar20;
        uVar17 = uVar17 + 1;
        pdVar9 = pdVar9 + 1;
        pdVar15 = pdVar15 + 1;
        pdVar18 = pdVar18 + 1;
        pdVar19 = pdVar19 + 1;
      } while (uVar13 != uVar17);
    }
  }
  return bVar3;
}

Assistant:

bool getComplementarityViolations(const HighsLp& lp,
                                  const HighsSolution& solution,
                                  double& max_complementarity_violation,
                                  double& sum_complementarity_violations) {
  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;
  if (!solution.dual_valid) return false;

  max_complementarity_violation = 0;
  sum_complementarity_violations = 0;
  double primal_residual = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal =
        is_col ? solution.col_value[iVar] : solution.row_value[iRow];
    const double dual =
        is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free
      primal_residual = 1;
    } else {
      const double mid = (lower + upper) * 0.5;
      primal_residual =
          primal < mid ? std::fabs(lower - primal) : std::fabs(upper - primal);
    }
    const double dual_residual = std::fabs(dual);
    const double complementarity_violation = primal_residual * dual_residual;
    sum_complementarity_violations += complementarity_violation;
    max_complementarity_violation =
        std::max(complementarity_violation, max_complementarity_violation);
  }
  return true;
}